

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O0

void __thiscall
wasm::OptUtils::FunctionRefReplacer::FunctionRefReplacer
          (FunctionRefReplacer *this,MaybeReplace *maybeReplace)

{
  MaybeReplace *maybeReplace_local;
  FunctionRefReplacer *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
  ::WalkerPass(&this->
                super_WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
              );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__FunctionRefReplacer_0309b250;
  std::function<void_(wasm::Name_&)>::function(&this->maybeReplace,maybeReplace);
  return;
}

Assistant:

FunctionRefReplacer(MaybeReplace maybeReplace) : maybeReplace(maybeReplace) {}